

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFooWhenResolved
          (TestMoreStuffImpl *this,CallFooWhenResolvedContext context)

{
  _func_int *p_Var1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *this_00;
  CallContextHook *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar3;
  undefined1 local_c8 [8];
  Own<capnp::ClientHook> local_c0;
  CallContextHook *local_b0;
  Own<kj::_::PromiseNode> local_a8;
  CallFooWhenResolvedContext context_local;
  Own<kj::_::PromiseNode> intermediate;
  Client cap;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  Reader params;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  context_local.hook = in_RDX;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
  ::getParams(&params,&context_local);
  capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams::Reader::getCap
            (&cap,&params);
  Capability::Client::whenResolved((Client *)&local_a8);
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)local_c8,&cap);
  local_b0 = context_local.hook;
  this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_a8,
             kj::_::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1043:34),_kj::_::PropagateException>
             ::anon_class_32_2_dc087ca5_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_003952b8;
  p_Var1 = *(_func_int **)((long)local_c8 + -0x18);
  pPVar2 = *(PromiseNode **)(p_Var1 + (long)(local_c8 + 8));
  this_00[1].dependency.disposer = *(Disposer **)(local_c8 + (long)p_Var1);
  this_00[1].dependency.ptr = pPVar2;
  *(undefined8 *)(p_Var1 + (long)(local_c8 + 8)) = 0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&Capability::Client::typeinfo;
  this_00[1].continuationTracePtr = local_b0;
  intermediate.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)this_00;
  kj::_::maybeChain<void>(&local_68,(Promise<void> *)&intermediate);
  pPVar2 = local_68.ptr;
  local_58.disposer = local_68.disposer;
  local_68.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode>::dispose(&local_68);
  *(Disposer **)&this->super_Server = local_68.disposer;
  *(PromiseNode **)&(this->super_Server).field_0x8 = pPVar2;
  local_58.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode>::dispose(&local_58);
  kj::Own<kj::_::PromiseNode>::dispose(&intermediate);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_c8 + 8));
  kj::Own<kj::_::PromiseNode>::dispose(&local_a8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&cap.field_0x8);
  PVar3.super_PromiseBase.node.ptr = extraout_RDX;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFooWhenResolved(CallFooWhenResolvedContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  return cap.whenResolved().then([KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
    auto request = cap.fooRequest();
    request.setI(123);
    request.setJ(true);

    return request.send().then(
        [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
          EXPECT_EQ("foo", response.getX());
          context.getResults().setS("bar");
        }